

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O0

void __thiscall
VL53L0X::VL53L0X(VL53L0X *this,uint8_t port,uint8_t address,int16_t xshutGPIOPin,bool ioMode2v8,
                float *calib)

{
  uint64_t uVar1;
  float *calib_local;
  bool ioMode2v8_local;
  int16_t xshutGPIOPin_local;
  uint8_t address_local;
  uint8_t port_local;
  VL53L0X *this_local;
  
  VL53LXX::VL53LXX(&this->super_VL53LXX,port,address,xshutGPIOPin,ioMode2v8,calib);
  (this->super_VL53LXX)._vptr_VL53LXX = (_func_int **)&PTR_init_00110a68;
  (this->super_VL53LXX).xshutGPIOPin = xshutGPIOPin;
  (this->super_VL53LXX).ioMode2v8 = ioMode2v8;
  (this->super_VL53LXX).gpioInitialized = false;
  this->ioTimeout = 0;
  this->didTimeout = false;
  *(undefined4 *)&(this->super_VL53LXX).field_0x6c = 33000;
  this->stopVariable = '\0';
  uVar1 = milliseconds();
  this->timeoutStartMilliseconds = uVar1;
  return;
}

Assistant:

VL53L0X::VL53L0X(uint8_t port, const uint8_t address, const int16_t xshutGPIOPin, bool ioMode2v8, float *calib):
    VL53LXX(port, address, xshutGPIOPin, ioMode2v8, calib)
{
	this->xshutGPIOPin = xshutGPIOPin;
	this->ioMode2v8 = ioMode2v8;
	this->gpioInitialized = false;

	this->ioTimeout = 0;
	this->didTimeout = false;

	this->measurementTimingBudgetMicroseconds = 33000;
	this->stopVariable = 0;
	this->timeoutStartMilliseconds = milliseconds();
}